

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void embree::gather_grid(RTCGeometry geom,avector<Vec3fa> *positions,size_t width,size_t height,
                        uint *indices,avector<Vec3fa> *vertices,uint edgey)

{
  float *pfVar1;
  Vec3fa *pVVar2;
  Vec3fa *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  ulong local_70;
  
  uVar12 = (ulong)edgey;
  if (height == 0) {
    sVar11 = 0;
  }
  else {
    lVar14 = 0;
    local_70 = 0;
    do {
      uVar9 = (uint)uVar12;
      if (width == 0) {
        sVar11 = 0;
      }
      else {
        uVar10 = uVar12;
        lVar13 = lVar14;
        uVar15 = 1;
        do {
          pVVar3 = vertices->items + indices[uVar10 & 0xffffffff];
          fVar4 = (pVVar3->field_0).m128[1];
          fVar5 = (pVVar3->field_0).m128[2];
          fVar6 = (pVVar3->field_0).m128[3];
          pfVar1 = (float *)((long)&positions->items->field_0 + lVar13);
          *pfVar1 = (pVVar3->field_0).m128[0];
          pfVar1[1] = fVar4;
          pfVar1[2] = fVar5;
          pfVar1[3] = fVar6;
          uVar10 = rtcGetGeometryPreviousHalfEdge(geom,uVar10 & 0xffffffff);
          if (uVar15 < width) {
            uVar8 = rtcGetGeometryPreviousHalfEdge(geom,uVar10 & 0xffffffff);
            uVar10 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar8);
          }
          uVar9 = (uint)uVar10;
          lVar13 = lVar13 + 0x10;
          bVar16 = uVar15 != width;
          sVar11 = width;
          uVar15 = uVar15 + 1;
        } while (bVar16);
      }
      pVVar3 = vertices->items + indices[uVar9];
      fVar4 = (pVVar3->field_0).m128[1];
      fVar5 = (pVVar3->field_0).m128[2];
      fVar6 = (pVVar3->field_0).m128[3];
      pVVar2 = positions->items + local_70 * (width + 1) + sVar11;
      (pVVar2->field_0).m128[0] = (pVVar3->field_0).m128[0];
      (pVVar2->field_0).m128[1] = fVar4;
      (pVVar2->field_0).m128[2] = fVar5;
      (pVVar2->field_0).m128[3] = fVar6;
      uVar9 = rtcGetGeometryNextHalfEdge(geom,uVar12);
      uVar12 = (ulong)uVar9;
      local_70 = local_70 + 1;
      if (local_70 < height) {
        uVar8 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar12);
        uVar9 = rtcGetGeometryNextHalfEdge(geom,uVar8);
        uVar12 = (ulong)uVar9;
      }
      lVar14 = lVar14 + width * 0x10 + 0x10;
      sVar11 = height;
    } while (local_70 != height);
  }
  if (width != 0) {
    lVar14 = sVar11 * (width + 1) * 0x10;
    uVar10 = 1;
    do {
      pVVar3 = vertices->items + indices[uVar12];
      fVar4 = (pVVar3->field_0).m128[1];
      fVar5 = (pVVar3->field_0).m128[2];
      fVar6 = (pVVar3->field_0).m128[3];
      pfVar1 = (float *)((long)&positions->items->field_0 + lVar14);
      *pfVar1 = (pVVar3->field_0).m128[0];
      pfVar1[1] = fVar4;
      pfVar1[2] = fVar5;
      pfVar1[3] = fVar6;
      uVar9 = rtcGetGeometryNextHalfEdge(geom,uVar12);
      uVar12 = (ulong)uVar9;
      if (uVar10 < width) {
        uVar8 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar12);
        uVar9 = rtcGetGeometryNextHalfEdge(geom,uVar8);
        uVar12 = (ulong)uVar9;
      }
      lVar14 = lVar14 + 0x10;
      bVar16 = uVar10 != width;
      uVar10 = uVar10 + 1;
    } while (bVar16);
  }
  pVVar3 = positions->items;
  uVar7 = *(undefined8 *)((long)&vertices->items[indices[uVar12]].field_0 + 8);
  *(undefined8 *)&pVVar3[(width + 1) * height + width].field_0 =
       *(undefined8 *)&vertices->items[indices[uVar12]].field_0;
  *(undefined8 *)((long)&pVVar3[(width + 1) * height + width].field_0 + 8) = uVar7;
  return;
}

Assistant:

void gather_grid(RTCGeometry geom, avector<Vec3fa>& positions, size_t width, size_t height, unsigned int* indices, avector<Vec3fa>& vertices, unsigned int edgey)
  {
    //        
    // | <----------    <----------
    // |            /\ |           /\ .
    // | edgey       | |           |
    // |             | |           |
    // \/            | \/          |
    
    /* gather all rows */
    size_t y=0;
    for (; y<height; y++)
    {
      /* here edgey points from top/left vertex downwards */
      unsigned int edgex = edgey;

      /* gather all columns */
      size_t x=0;
      for (; x<width; x++)
      {
        /* here edgex points from left vertex of row downwards */
        positions[y*(width+1)+x] = vertices[indices[edgex]];

        /* prev -> prev -> opposite moves to the next column (unless we reach the right end) */
        edgex = rtcGetGeometryPreviousHalfEdge(geom,edgex);
        if (x+1 < width) {
          edgex = rtcGetGeometryPreviousHalfEdge(geom,edgex);
          edgex = rtcGetGeometryOppositeHalfEdge(geom,0,edgex);
        }
      }
      /* load rightmost vertex */
      positions[y*(width+1)+x] = vertices[indices[edgex]];

      /* next -> opposite -> next moves to next row (unless we reach the bottom) */
      edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      if (y+1 < height) {
        edgey = rtcGetGeometryOppositeHalfEdge(geom,0,edgey);
        edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      }
    }

    /* special treatment for last row, edgy points from the bottom/left vertex to the right */
    unsigned int edgex = edgey;
    for (size_t x=0; x<width; x++)
    {
      positions[y*(width+1)+x] = vertices[indices[edgex]];

      /* next -> opposite -> next moves to the next column (unless we reach the right end) */
      edgex = rtcGetGeometryNextHalfEdge(geom,edgex);
      if (x+1 < width) {
        edgex = rtcGetGeometryOppositeHalfEdge(geom,0,edgex);
        edgex = rtcGetGeometryNextHalfEdge(geom,edgex);
      }
    }
    /* load rightmost vertex */
    positions[height*(width+1)+width] = vertices[indices[edgex]];
  }